

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGjkEpa2.cpp
# Opt level: O1

_ __thiscall gjkepa2_impl::EPA::Evaluate(EPA *this,GJK *gjk,btVector3 *guess)

{
  U *pUVar1;
  undefined8 uVar2;
  sSimplex *psVar3;
  sSV *psVar4;
  sSV *psVar5;
  sSV *psVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  sFace *psVar9;
  bool bVar10;
  sSV *tmp;
  sFace *psVar11;
  sFace *psVar12;
  sFace *psVar13;
  sFace *psVar14;
  U UVar15;
  _ _Var16;
  sFace *psVar17;
  U UVar18;
  sFace *d;
  ulong uVar19;
  ulong uVar20;
  float fVar21;
  btScalar bVar22;
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  sHorizon horizon;
  btScalar local_c4;
  sSV *local_b0;
  sSV *local_a8;
  sSV *local_a0;
  sHorizon local_78;
  float local_58;
  btScalar bStack_54;
  float fStack_50;
  btScalar bStack_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  sSV *c;
  
  psVar3 = gjk->m_simplex;
  if ((1 < psVar3->rank) && (bVar10 = GJK::EncloseOrigin(gjk), bVar10)) {
    psVar11 = (this->m_hull).root;
    if (psVar11 != (sFace *)0x0) {
      UVar18 = (this->m_hull).count;
      UVar15 = (this->m_stock).count;
      do {
        if (psVar11->l[1] != (sFace *)0x0) {
          psVar11->l[1]->l[0] = psVar11->l[0];
        }
        if (psVar11->l[0] != (sFace *)0x0) {
          psVar11->l[0]->l[1] = psVar11->l[1];
        }
        if ((this->m_hull).root == psVar11) {
          (this->m_hull).root = psVar11->l[1];
        }
        psVar11->l[0] = (sFace *)0x0;
        psVar11->l[1] = (this->m_stock).root;
        psVar12 = (this->m_stock).root;
        if (psVar12 != (sFace *)0x0) {
          psVar12->l[0] = psVar11;
        }
        (this->m_stock).root = psVar11;
        UVar15 = UVar15 + 1;
        psVar11 = (this->m_hull).root;
        UVar18 = UVar18 - 1;
      } while (psVar11 != (sFace *)0x0);
      (this->m_hull).count = UVar18;
      (this->m_stock).count = UVar15;
    }
    this->m_status = Valid;
    this->m_nextsv = 0;
    psVar4 = psVar3->c[0];
    psVar5 = psVar3->c[1];
    psVar6 = psVar3->c[3];
    fVar28 = (psVar6->w).m_floats[0];
    fVar32 = (psVar6->w).m_floats[1];
    fVar21 = (psVar4->w).m_floats[0] - fVar28;
    fVar27 = (psVar4->w).m_floats[1] - fVar32;
    fVar31 = (psVar6->w).m_floats[2];
    fVar23 = (psVar4->w).m_floats[2] - fVar31;
    fVar29 = (psVar5->w).m_floats[0] - fVar28;
    fVar26 = (psVar5->w).m_floats[1] - fVar32;
    fVar30 = (psVar5->w).m_floats[2] - fVar31;
    psVar6 = psVar3->c[2];
    fVar28 = (psVar6->w).m_floats[0] - fVar28;
    fVar32 = (psVar6->w).m_floats[1] - fVar32;
    fVar31 = (psVar6->w).m_floats[2] - fVar31;
    if ((fVar21 * fVar26 * fVar31 +
        (((fVar27 * fVar30 * fVar28 + fVar23 * fVar29 * fVar32) - fVar30 * fVar21 * fVar32) -
        fVar29 * fVar27 * fVar31)) - fVar26 * fVar23 * fVar28 < 0.0) {
      psVar3->c[0] = psVar5;
      psVar3->c[1] = psVar4;
      *(ulong *)psVar3->p =
           CONCAT44((int)*(undefined8 *)psVar3->p,(int)((ulong)*(undefined8 *)psVar3->p >> 0x20));
    }
    psVar11 = newface(this,psVar3->c[0],psVar3->c[1],psVar3->c[2],true);
    psVar12 = newface(this,psVar3->c[1],psVar3->c[0],psVar3->c[3],true);
    psVar13 = newface(this,psVar3->c[2],psVar3->c[1],psVar3->c[3],true);
    c = psVar3->c[3];
    psVar14 = newface(this,psVar3->c[0],psVar3->c[2],c,true);
    _Var16 = (_)c;
    UVar18 = (this->m_hull).count;
    if (UVar18 == 4) {
      d = (this->m_hull).root;
      psVar17 = d->l[1];
      if (psVar17 != (sFace *)0x0) {
        fVar28 = d->d * d->d;
        do {
          fVar32 = psVar17->d * psVar17->d;
          psVar9 = psVar17;
          if (fVar28 <= fVar32) {
            fVar32 = fVar28;
            psVar9 = d;
          }
          d = psVar9;
          fVar28 = fVar32;
          psVar17 = psVar17->l[1];
        } while (psVar17 != (sFace *)0x0);
      }
      local_48 = *(undefined8 *)(d->n).m_floats;
      uStack_40 = *(undefined8 *)((d->n).m_floats + 2);
      local_c4 = d->d;
      local_a8 = d->c[0];
      local_a0 = d->c[1];
      local_b0 = d->c[2];
      UVar15 = 0;
      psVar11->e[0] = '\0';
      psVar11->f[0] = psVar12;
      psVar12->e[0] = '\0';
      psVar12->f[0] = psVar11;
      psVar11->e[1] = '\0';
      psVar11->f[1] = psVar13;
      psVar13->e[0] = '\x01';
      psVar13->f[0] = psVar11;
      psVar11->e[2] = '\0';
      psVar11->f[2] = psVar14;
      psVar14->e[0] = '\x02';
      psVar14->f[0] = psVar11;
      psVar12->e[1] = '\x02';
      psVar12->f[1] = psVar14;
      psVar14->e[2] = '\x01';
      psVar14->f[2] = psVar12;
      psVar12->e[2] = '\x01';
      psVar12->f[2] = psVar13;
      psVar13->e[1] = '\x02';
      psVar13->e[2] = '\x01';
      psVar13->f[1] = psVar12;
      psVar13->f[2] = psVar14;
      psVar14->e[1] = '\x02';
      psVar14->f[1] = psVar13;
      this->m_status = Valid;
      while( true ) {
        uVar19 = (ulong)this->m_nextsv;
        if (0x3f < uVar19) break;
        local_78.cf = (sFace *)0x0;
        local_78.ff = (sFace *)0x0;
        local_78.nf = 0;
        this->m_nextsv = this->m_nextsv + 1;
        UVar15 = UVar15 + 1;
        d->pass = (U1)UVar15;
        GJK::getsupport(gjk,&d->n,this->m_sv_store + uVar19);
        if (((d->n).m_floats[2] * this->m_sv_store[uVar19].w.m_floats[2] +
            (d->n).m_floats[0] * this->m_sv_store[uVar19].w.m_floats[0] +
            (d->n).m_floats[1] * this->m_sv_store[uVar19].w.m_floats[1]) - d->d <= 0.0001) {
          this->m_status = AccuraryReached;
LAB_0017e70b:
          bVar10 = true;
        }
        else {
          uVar20 = 0;
          do {
            bVar10 = expand(this,UVar15,this->m_sv_store + uVar19,d->f[uVar20],(uint)d->e[uVar20],
                            &local_78);
            if (1 < uVar20) break;
            uVar20 = uVar20 + 1;
          } while (bVar10);
          if (!bVar10 || local_78.nf < 3) {
            this->m_status = InvalidHull;
            goto LAB_0017e70b;
          }
          (local_78.cf)->e[1] = '\x02';
          (local_78.cf)->f[1] = local_78.ff;
          (local_78.ff)->e[2] = '\x01';
          (local_78.ff)->f[2] = local_78.cf;
          if (d->l[1] != (sFace *)0x0) {
            d->l[1]->l[0] = d->l[0];
          }
          if (d->l[0] != (sFace *)0x0) {
            d->l[0]->l[1] = d->l[1];
          }
          if ((this->m_hull).root == d) {
            (this->m_hull).root = d->l[1];
          }
          pUVar1 = &(this->m_hull).count;
          *pUVar1 = *pUVar1 - 1;
          d->l[0] = (sFace *)0x0;
          d->l[1] = (this->m_stock).root;
          psVar11 = (this->m_stock).root;
          if (psVar11 != (sFace *)0x0) {
            psVar11->l[0] = d;
          }
          (this->m_stock).root = d;
          pUVar1 = &(this->m_stock).count;
          *pUVar1 = *pUVar1 + 1;
          d = (this->m_hull).root;
          psVar11 = d->l[1];
          if (psVar11 != (sFace *)0x0) {
            fVar28 = d->d * d->d;
            do {
              fVar32 = psVar11->d * psVar11->d;
              psVar12 = psVar11;
              if (fVar28 <= fVar32) {
                fVar32 = fVar28;
                psVar12 = d;
              }
              d = psVar12;
              fVar28 = fVar32;
              psVar11 = psVar11->l[1];
            } while (psVar11 != (sFace *)0x0);
          }
          local_48 = *(undefined8 *)(d->n).m_floats;
          uStack_40 = *(undefined8 *)((d->n).m_floats + 2);
          local_c4 = d->d;
          local_a8 = d->c[0];
          local_a0 = d->c[1];
          local_b0 = d->c[2];
          bVar10 = false;
        }
        if ((bVar10) || (UVar15 == 0xff)) goto LAB_0017e726;
      }
      this->m_status = OutOfVertices;
LAB_0017e726:
      fVar29 = (float)local_48 * local_c4;
      fVar32 = local_48._4_4_ * local_c4;
      local_58 = (float)uStack_40 * local_c4;
      (this->m_normal).m_floats[0] = (float)local_48;
      (this->m_normal).m_floats[1] = local_48._4_4_;
      (this->m_normal).m_floats[2] = (float)uStack_40;
      (this->m_normal).m_floats[3] = uStack_40._4_4_;
      this->m_depth = local_c4;
      (this->m_result).rank = 3;
      (this->m_result).c[0] = local_a8;
      (this->m_result).c[1] = local_a0;
      (this->m_result).c[2] = local_b0;
      fVar21 = (local_a0->w).m_floats[0] - fVar29;
      fVar23 = (local_a0->w).m_floats[1] - fVar32;
      fVar31 = (local_a0->w).m_floats[2] - local_58;
      fVar27 = (local_b0->w).m_floats[0] - fVar29;
      fVar28 = (local_b0->w).m_floats[1] - fVar32;
      fVar30 = (local_b0->w).m_floats[2] - local_58;
      fVar26 = fVar23 * fVar30 - fVar28 * fVar31;
      fVar31 = fVar31 * fVar27 - fVar30 * fVar21;
      fVar28 = fVar28 * fVar21 - fVar27 * fVar23;
      fVar28 = fVar28 * fVar28 + fVar26 * fVar26 + fVar31 * fVar31;
      bStack_54 = uStack_40._4_4_;
      fStack_50 = (float)uStack_40;
      bStack_4c = uStack_40._4_4_;
      if (fVar28 < 0.0) {
        bVar22 = sqrtf(fVar28);
      }
      else {
        bVar22 = SQRT(fVar28);
      }
      (this->m_result).p[0] = bVar22;
      fVar21 = (local_b0->w).m_floats[0] - fVar29;
      fVar23 = (local_b0->w).m_floats[1] - fVar32;
      fVar31 = (local_b0->w).m_floats[2] - local_58;
      fVar27 = (local_a8->w).m_floats[0] - fVar29;
      fVar28 = (local_a8->w).m_floats[1] - fVar32;
      fVar30 = (local_a8->w).m_floats[2] - local_58;
      fVar26 = fVar23 * fVar30 - fVar28 * fVar31;
      fVar31 = fVar31 * fVar27 - fVar30 * fVar21;
      fVar28 = fVar28 * fVar21 - fVar27 * fVar23;
      fVar28 = fVar28 * fVar28 + fVar26 * fVar26 + fVar31 * fVar31;
      if (fVar28 < 0.0) {
        bVar22 = sqrtf(fVar28);
      }
      else {
        bVar22 = SQRT(fVar28);
      }
      (this->m_result).p[1] = bVar22;
      fVar21 = (local_a8->w).m_floats[0] - fVar29;
      fVar23 = (local_a8->w).m_floats[1] - fVar32;
      fVar28 = (local_a8->w).m_floats[2] - local_58;
      fVar29 = (local_a0->w).m_floats[0] - fVar29;
      fVar32 = (local_a0->w).m_floats[1] - fVar32;
      fVar31 = (local_a0->w).m_floats[2] - local_58;
      fVar26 = fVar23 * fVar31 - fVar32 * fVar28;
      fVar31 = fVar28 * fVar29 - fVar31 * fVar21;
      fVar28 = fVar32 * fVar21 - fVar29 * fVar23;
      fVar28 = fVar28 * fVar28 + fVar26 * fVar26 + fVar31 * fVar31;
      if (fVar28 < 0.0) {
        fVar28 = sqrtf(fVar28);
      }
      else {
        fVar28 = SQRT(fVar28);
      }
      uVar19 = *(ulong *)(this->m_result).p;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = uVar19;
      fVar32 = (float)(uVar19 >> 0x20);
      fVar31 = fVar32 + (float)uVar19 + fVar28;
      auVar25._4_4_ = fVar31;
      auVar25._0_4_ = fVar31;
      auVar25._8_4_ = fVar32;
      auVar25._12_4_ = fVar32;
      auVar25 = divps(auVar24,auVar25);
      *(long *)(this->m_result).p = auVar25._0_8_;
      (this->m_result).p[2] = fVar28 / fVar31;
      _Var16 = this->m_status;
    }
    if (UVar18 == 4) {
      return _Var16;
    }
  }
  this->m_status = FallBack;
  auVar7._8_4_ = -guess->m_floats[2];
  auVar7._0_8_ = *(ulong *)guess->m_floats ^ 0x8000000080000000;
  auVar7._12_4_ = 0;
  *(undefined1 (*) [16])(this->m_normal).m_floats = auVar7;
  fVar28 = (this->m_normal).m_floats[0];
  fVar32 = (this->m_normal).m_floats[1];
  fVar31 = (this->m_normal).m_floats[2];
  fVar28 = fVar31 * fVar31 + fVar28 * fVar28 + fVar32 * fVar32;
  if (fVar28 < 0.0) {
    fVar28 = sqrtf(fVar28);
  }
  else {
    fVar28 = SQRT(fVar28);
  }
  if (fVar28 <= 0.0) {
    (this->m_normal).m_floats[0] = 1.0;
    (this->m_normal).m_floats[1] = 0.0;
    (this->m_normal).m_floats[2] = 0.0;
    (this->m_normal).m_floats[3] = 0.0;
  }
  else {
    fVar28 = 1.0 / fVar28;
    uVar2 = *(undefined8 *)(this->m_normal).m_floats;
    auVar8._4_4_ = fVar28 * (float)((ulong)uVar2 >> 0x20);
    auVar8._0_4_ = fVar28 * (float)uVar2;
    auVar8._8_4_ = fVar28 * (this->m_normal).m_floats[2];
    auVar8._12_4_ = 0;
    *(undefined1 (*) [16])(this->m_normal).m_floats = auVar8;
  }
  this->m_depth = 0.0;
  (this->m_result).rank = 1;
  (this->m_result).c[0] = psVar3->c[0];
  (this->m_result).p[0] = 1.0;
  return this->m_status;
}

Assistant:

eStatus::_			Evaluate(GJK& gjk,const btVector3& guess)
			{
				GJK::sSimplex&	simplex=*gjk.m_simplex;
				if((simplex.rank>1)&&gjk.EncloseOrigin())
				{

					/* Clean up				*/ 
					while(m_hull.root)
					{
						sFace*	f = m_hull.root;
						remove(m_hull,f);
						append(m_stock,f);
					}
					m_status	=	eStatus::Valid;
					m_nextsv	=	0;
					/* Orient simplex		*/ 
					if(gjk.det(	simplex.c[0]->w-simplex.c[3]->w,
						simplex.c[1]->w-simplex.c[3]->w,
						simplex.c[2]->w-simplex.c[3]->w)<0)
					{
						btSwap(simplex.c[0],simplex.c[1]);
						btSwap(simplex.p[0],simplex.p[1]);
					}
					/* Build initial hull	*/ 
					sFace*	tetra[]={newface(simplex.c[0],simplex.c[1],simplex.c[2],true),
						newface(simplex.c[1],simplex.c[0],simplex.c[3],true),
						newface(simplex.c[2],simplex.c[1],simplex.c[3],true),
						newface(simplex.c[0],simplex.c[2],simplex.c[3],true)};
					if(m_hull.count==4)
					{
						sFace*		best=findbest();
						sFace		outer=*best;
						U			pass=0;
						U			iterations=0;
						bind(tetra[0],0,tetra[1],0);
						bind(tetra[0],1,tetra[2],0);
						bind(tetra[0],2,tetra[3],0);
						bind(tetra[1],1,tetra[3],2);
						bind(tetra[1],2,tetra[2],1);
						bind(tetra[2],2,tetra[3],1);
						m_status=eStatus::Valid;
						for(;iterations<EPA_MAX_ITERATIONS;++iterations)
						{
							if(m_nextsv<EPA_MAX_VERTICES)
							{	
								sHorizon		horizon;
								sSV*			w=&m_sv_store[m_nextsv++];
								bool			valid=true;					
								best->pass	=	(U1)(++pass);
								gjk.getsupport(best->n,*w);
								const btScalar	wdist=btDot(best->n,w->w)-best->d;
								if(wdist>EPA_ACCURACY)
								{
									for(U j=0;(j<3)&&valid;++j)
									{
										valid&=expand(	pass,w,
											best->f[j],best->e[j],
											horizon);
									}
									if(valid&&(horizon.nf>=3))
									{
										bind(horizon.cf,1,horizon.ff,2);
										remove(m_hull,best);
										append(m_stock,best);
										best=findbest();
										outer=*best;
									} else { m_status=eStatus::InvalidHull;break; }
								} else { m_status=eStatus::AccuraryReached;break; }
							} else { m_status=eStatus::OutOfVertices;break; }
						}
						const btVector3	projection=outer.n*outer.d;
						m_normal	=	outer.n;
						m_depth		=	outer.d;
						m_result.rank	=	3;
						m_result.c[0]	=	outer.c[0];
						m_result.c[1]	=	outer.c[1];
						m_result.c[2]	=	outer.c[2];
						m_result.p[0]	=	btCross(	outer.c[1]->w-projection,
							outer.c[2]->w-projection).length();
						m_result.p[1]	=	btCross(	outer.c[2]->w-projection,
							outer.c[0]->w-projection).length();
						m_result.p[2]	=	btCross(	outer.c[0]->w-projection,
							outer.c[1]->w-projection).length();
						const btScalar	sum=m_result.p[0]+m_result.p[1]+m_result.p[2];
						m_result.p[0]	/=	sum;
						m_result.p[1]	/=	sum;
						m_result.p[2]	/=	sum;
						return(m_status);
					}
				}
				/* Fallback		*/ 
				m_status	=	eStatus::FallBack;
				m_normal	=	-guess;
				const btScalar	nl=m_normal.length();
				if(nl>0)
					m_normal	=	m_normal/nl;
				else
					m_normal	=	btVector3(1,0,0);
				m_depth	=	0;
				m_result.rank=1;
				m_result.c[0]=simplex.c[0];
				m_result.p[0]=1;	
				return(m_status);
			}